

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowsReporters.cpp
# Opt level: O0

void __thiscall
ApprovalTests::Windows::TortoiseTextDiffReporter::TortoiseTextDiffReporter
          (TortoiseTextDiffReporter *this)

{
  DiffInfo *in_RDI;
  DiffInfo *in_stack_ffffffffffffffd8;
  GenericDiffReporter *in_stack_ffffffffffffffe0;
  
  DiffPrograms::Windows::TORTOISE_TEXT_DIFF();
  GenericDiffReporter::GenericDiffReporter(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  DiffInfo::~DiffInfo(in_RDI);
  *(undefined ***)&in_RDI->program = &PTR__TortoiseTextDiffReporter_001c92f8;
  return;
}

Assistant:

TortoiseTextDiffReporter::TortoiseTextDiffReporter()
            : GenericDiffReporter(DiffPrograms::Windows::TORTOISE_TEXT_DIFF())
        {
        }